

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O0

GLenum __thiscall
deqp::gles31::Functional::anon_unknown_1::NegativeTexParameterCase::getParamGLEnum
          (NegativeTexParameterCase *this)

{
  NegativeTexParameterCase *this_local;
  
  switch(this->m_texParam) {
  case TEXTURE_MIN_FILTER:
    this_local._4_4_ = 0x2801;
    break;
  case TEXTURE_MAG_FILTER:
    this_local._4_4_ = 0x2800;
    break;
  case TEXTURE_WRAP_S:
    this_local._4_4_ = 0x2802;
    break;
  case TEXTURE_WRAP_T:
    this_local._4_4_ = 0x2803;
    break;
  case TEXTURE_WRAP_R:
    this_local._4_4_ = 0x8072;
    break;
  case TEXTURE_MIN_LOD:
    this_local._4_4_ = 0x813a;
    break;
  case TEXTURE_MAX_LOD:
    this_local._4_4_ = 0x813b;
    break;
  case TEXTURE_COMPARE_MODE:
    this_local._4_4_ = 0x884c;
    break;
  case TEXTURE_COMPARE_FUNC:
    this_local._4_4_ = 0x884d;
    break;
  case TEXTURE_BASE_LEVEL:
    this_local._4_4_ = 0x813c;
    break;
  default:
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

glw::GLenum NegativeTexParameterCase::getParamGLEnum (void) const
{
	switch (m_texParam)
	{
		case TEXTURE_MIN_FILTER:	return GL_TEXTURE_MIN_FILTER;
		case TEXTURE_MAG_FILTER:	return GL_TEXTURE_MAG_FILTER;
		case TEXTURE_WRAP_S:		return GL_TEXTURE_WRAP_S;
		case TEXTURE_WRAP_T:		return GL_TEXTURE_WRAP_T;
		case TEXTURE_WRAP_R:		return GL_TEXTURE_WRAP_R;
		case TEXTURE_MIN_LOD:		return GL_TEXTURE_MIN_LOD;
		case TEXTURE_MAX_LOD:		return GL_TEXTURE_MAX_LOD;
		case TEXTURE_COMPARE_MODE:	return GL_TEXTURE_COMPARE_MODE;
		case TEXTURE_COMPARE_FUNC:	return GL_TEXTURE_COMPARE_FUNC;
		case TEXTURE_BASE_LEVEL:	return GL_TEXTURE_BASE_LEVEL;
		default:
			DE_ASSERT(DE_FALSE);
			return 0;
	}
}